

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_highbd_quantize_sse4.c
# Opt level: O1

void av1_highbd_quantize_fp_sse4_1
               (tran_low_t *coeff_ptr,intptr_t count,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan,int log_scale)

{
  int *piVar1;
  int *piVar2;
  short *psVar3;
  short sVar4;
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  int iVar13;
  ulong uVar14;
  byte bVar15;
  int iVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar23;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar30 [16];
  uint uVar32;
  undefined1 auVar31 [16];
  uint uVar33;
  undefined1 in_XMM4 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  ulong uVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  ulong uVar51;
  undefined1 auVar50 [16];
  int iVar62;
  undefined1 in_XMM7 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  ulong uVar63;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  ulong uVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  ulong uVar73;
  undefined1 auVar72 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  ulong local_88;
  short local_48;
  short sStack_46;
  short sStack_44;
  short sStack_42;
  short sStack_40;
  short sStack_3e;
  short sStack_3c;
  short sStack_3a;
  int iVar27;
  int iVar28;
  int iVar29;
  
  uVar18 = 0x10 - log_scale;
  memset(qcoeff_ptr,0,count * 4);
  memset(dqcoeff_ptr,0,count * 4);
  bVar15 = (byte)log_scale;
  iVar16 = (1 << (bVar15 & 0x1f)) >> 1;
  iVar13 = round_ptr[1] + iVar16 >> (bVar15 & 0x1f);
  auVar34 = *(undefined1 (*) [16])coeff_ptr;
  auVar30 = pmovsxwq(in_XMM2,*(undefined4 *)quant_ptr);
  auVar31 = ZEXT416(*(uint *)dequant_ptr);
  auVar52 = pmovsxwd(in_XMM7,auVar31);
  iVar62 = auVar52._4_4_;
  auVar74 = pabsd(in_XMM10,auVar34);
  auVar45._0_4_ = auVar34._0_4_ >> 0x1f;
  auVar45._4_4_ = auVar34._4_4_ >> 0x1f;
  auVar45._8_4_ = auVar34._8_4_ >> 0x1f;
  auVar45._12_4_ = auVar34._12_4_ >> 0x1f;
  auVar34._0_4_ = (*round_ptr + iVar16 >> (bVar15 & 0x1f)) + auVar74._0_4_;
  auVar34._4_4_ = iVar13 + auVar74._4_4_;
  auVar34._8_4_ = iVar13 + auVar74._8_4_;
  auVar34._12_4_ = iVar13 + auVar74._12_4_;
  auVar69._4_4_ = auVar34._8_4_;
  auVar69._0_4_ = auVar34._8_4_;
  auVar69._8_4_ = auVar34._12_4_;
  auVar69._12_4_ = auVar34._12_4_;
  auVar34 = pmovzxdq(in_XMM4,auVar34);
  auVar34 = pmuldq(auVar34,auVar30);
  uVar63 = (ulong)uVar18;
  auVar35._0_8_ = auVar34._0_8_ >> uVar63;
  auVar35._8_8_ = auVar34._8_8_ >> uVar63;
  auVar34 = pmovsxwq(auVar31,auVar31);
  auVar64 = pmuldq(auVar35,auVar34);
  uVar14 = (ulong)(uint)log_scale;
  iVar16 = log_scale + 1;
  auVar31._0_4_ = -(uint)(auVar74._0_4_ << iVar16 < auVar52._0_4_);
  auVar31._4_4_ = -(uint)(auVar74._4_4_ < iVar62);
  auVar31._8_4_ = -(uint)(auVar74._8_4_ < iVar62);
  auVar31._12_4_ = -(uint)(auVar74._12_4_ < iVar62);
  auVar74._8_4_ = auVar30._8_4_;
  auVar74._12_4_ = auVar30._12_4_;
  auVar74._0_8_ = auVar30._8_8_;
  auVar30 = pmuldq(auVar69,auVar74);
  auVar70._0_8_ = auVar30._0_8_ >> uVar63;
  auVar70._8_8_ = auVar30._8_8_ >> uVar63;
  uVar32 = auVar34._8_4_;
  uVar33 = auVar34._12_4_;
  auVar78._0_8_ = auVar34._8_8_;
  auVar78._8_4_ = uVar32;
  auVar78._12_4_ = uVar33;
  auVar36._0_4_ = (undefined4)auVar35._0_8_;
  auVar36._4_4_ = (int)auVar35._8_8_;
  auVar36._8_4_ = (int)auVar70._0_8_;
  auVar36._12_4_ = (int)auVar70._8_8_;
  auVar34 = pmuldq(auVar70,auVar78);
  auVar65._0_4_ = (undefined4)(auVar64._0_8_ >> uVar14);
  auVar65._4_4_ = (int)(auVar64._8_8_ >> uVar14);
  auVar65._8_4_ = (int)(auVar34._0_8_ >> uVar14);
  auVar65._12_4_ = (int)(auVar34._8_8_ >> uVar14);
  auVar64 = pmovsxbd(in_XMM12,0x1010101);
  auVar30 = psignd(auVar36,auVar45 | auVar64);
  auVar34 = psignd(auVar65,auVar45 | auVar64);
  *(undefined1 (*) [16])qcoeff_ptr = ~auVar31 & auVar30;
  *(undefined1 (*) [16])dqcoeff_ptr = ~auVar31 & auVar34;
  auVar34 = *(undefined1 (*) [16])(coeff_ptr + 4);
  auVar31 = pabsd(auVar30,auVar34);
  auVar30._0_4_ = auVar34._0_4_ >> 0x1f;
  auVar30._4_4_ = auVar34._4_4_ >> 0x1f;
  auVar30._8_4_ = auVar34._8_4_ >> 0x1f;
  auVar30._12_4_ = auVar34._12_4_ >> 0x1f;
  auVar46._0_4_ = auVar31._0_4_ + iVar13;
  auVar46._4_4_ = auVar31._4_4_ + iVar13;
  auVar46._8_4_ = auVar31._8_4_ + iVar13;
  auVar46._12_4_ = auVar31._12_4_ + iVar13;
  auVar53._4_4_ = auVar46._8_4_;
  auVar53._0_4_ = auVar46._8_4_;
  auVar53._8_4_ = auVar46._12_4_;
  auVar53._12_4_ = auVar46._12_4_;
  auVar34 = pmovzxdq(auVar46,auVar46);
  auVar34 = pmuldq(auVar34,auVar74);
  uVar63 = (ulong)uVar18;
  auVar47._0_8_ = auVar34._0_8_ >> uVar63;
  auVar47._8_8_ = auVar34._8_8_ >> uVar63;
  auVar52 = pmuldq(auVar47,auVar78);
  uVar14 = (ulong)(uint)log_scale;
  auVar71._0_4_ = -(uint)(auVar31._0_4_ << iVar16 < iVar62);
  auVar71._4_4_ = -(uint)(auVar31._4_4_ < iVar62);
  auVar71._8_4_ = -(uint)(auVar31._8_4_ < iVar62);
  auVar71._12_4_ = -(uint)(auVar31._12_4_ < iVar62);
  auVar34 = pmuldq(auVar53,auVar74);
  auVar54._0_8_ = auVar34._0_8_ >> uVar63;
  auVar54._8_8_ = auVar34._8_8_ >> uVar63;
  auVar48._0_4_ = (undefined4)auVar47._0_8_;
  auVar48._4_4_ = (int)auVar47._8_8_;
  auVar48._8_4_ = (int)auVar54._0_8_;
  auVar48._12_4_ = (int)auVar54._8_8_;
  auVar34 = pmuldq(auVar54,auVar78);
  uVar63 = auVar34._8_8_ >> uVar14;
  auVar66._0_4_ = (undefined4)(auVar52._0_8_ >> uVar14);
  auVar66._4_4_ = (int)(auVar52._8_8_ >> uVar14);
  auVar66._8_4_ = (int)(auVar34._0_8_ >> uVar14);
  auVar66._12_4_ = (int)uVar63;
  auVar31 = psignd(auVar48,auVar30 | auVar64);
  auVar67 = psignd(auVar66,auVar30 | auVar64);
  auVar67 = ~auVar71 & auVar67;
  *(undefined1 (*) [16])(qcoeff_ptr + 4) = ~auVar71 & auVar31;
  *(undefined1 (*) [16])(dqcoeff_ptr + 4) = auVar67;
  auVar37._0_4_ = -(uint)(*qcoeff_ptr == 0);
  auVar37._4_4_ = -(uint)(qcoeff_ptr[1] == 0);
  auVar37._8_4_ = -(uint)(qcoeff_ptr[2] == 0);
  auVar37._12_4_ = -(uint)(qcoeff_ptr[3] == 0);
  auVar52._0_4_ = -(uint)(qcoeff_ptr[4] == 0);
  auVar52._4_4_ = -(uint)(qcoeff_ptr[5] == 0);
  auVar52._8_4_ = -(uint)(qcoeff_ptr[6] == 0);
  auVar52._12_4_ = -(uint)(qcoeff_ptr[7] == 0);
  auVar34 = packssdw(auVar37,auVar52);
  auVar64._0_2_ = *iscan + auVar34._0_2_ + 1;
  auVar64._2_2_ = iscan[1] + auVar34._2_2_ + 1;
  auVar64._4_2_ = iscan[2] + auVar34._4_2_ + 1;
  auVar64._6_2_ = iscan[3] + auVar34._6_2_ + 1;
  auVar64._8_2_ = iscan[4] + auVar34._8_2_ + 1;
  auVar64._10_2_ = iscan[5] + auVar34._10_2_ + 1;
  auVar64._12_2_ = iscan[6] + auVar34._12_2_ + 1;
  auVar64._14_2_ = iscan[7] + auVar34._14_2_ + 1;
  auVar64 = ~auVar34 & auVar64;
  auVar38._2_2_ = (ushort)(-1 < auVar64._2_2_) * auVar64._2_2_;
  auVar38._0_2_ = (ushort)(-1 < auVar64._0_2_) * auVar64._0_2_;
  auVar38._4_2_ = (ushort)(-1 < auVar64._4_2_) * auVar64._4_2_;
  auVar38._6_2_ = (ushort)(-1 < auVar64._6_2_) * auVar64._6_2_;
  auVar38._8_2_ = (ushort)(-1 < auVar64._8_2_) * auVar64._8_2_;
  auVar38._10_2_ = (ushort)(-1 < auVar64._10_2_) * auVar64._10_2_;
  auVar38._12_2_ = (ushort)(-1 < auVar64._12_2_) * auVar64._12_2_;
  auVar38._14_2_ = (ushort)(-1 < auVar64._14_2_) * auVar64._14_2_;
  if (8 < count) {
    lVar17 = count + 8;
    uVar14 = (ulong)(uint)(0 >> (bVar15 & 0x1f));
    do {
      auVar34 = *(undefined1 (*) [16])((long)coeff_ptr + uVar14 * 2 + 0x20);
      auVar30 = *(undefined1 (*) [16])((long)coeff_ptr + uVar14 * 2 + 0x30);
      auVar31 = pabsd(auVar31,auVar34);
      auVar76._0_4_ = auVar34._0_4_ >> 0x1f;
      auVar76._4_4_ = auVar34._4_4_ >> 0x1f;
      auVar76._8_4_ = auVar34._8_4_ >> 0x1f;
      auVar76._12_4_ = auVar34._12_4_ >> 0x1f;
      auVar39._0_4_ = auVar31._0_4_ + iVar13;
      auVar39._4_4_ = auVar31._4_4_ + iVar13;
      auVar39._8_4_ = auVar31._8_4_ + iVar13;
      auVar39._12_4_ = auVar31._12_4_ + iVar13;
      auVar34 = pmovsxdq(auVar67,auVar39);
      uVar23 = auVar34._8_8_;
      uVar19 = (ulong)uVar18;
      uVar68 = (ulong)auVar34._0_4_ * (ulong)auVar74._8_4_ +
               ((auVar34._0_8_ >> 0x20) * (ulong)auVar74._8_4_ +
                (ulong)auVar34._0_4_ * (ulong)auVar74._12_4_ << 0x20) >> uVar19;
      uVar73 = (uVar23 & 0xffffffff) * (ulong)auVar74._8_4_ +
               ((uVar23 >> 0x20) * (ulong)auVar74._8_4_ +
                (uVar23 & 0xffffffff) * (ulong)auVar74._12_4_ << 0x20) >> uVar19;
      auVar77._0_4_ = -(uint)(auVar31._0_4_ << iVar16 < iVar62);
      auVar77._4_4_ = -(uint)(auVar31._4_4_ < iVar62);
      auVar77._8_4_ = -(uint)(auVar31._8_4_ < iVar62);
      auVar77._12_4_ = -(uint)(auVar31._12_4_ < iVar62);
      auVar5._4_8_ = uVar63;
      auVar5._0_4_ = auVar39._8_4_;
      auVar55._0_8_ = auVar5._0_8_ << 0x20;
      auVar55._8_4_ = auVar39._8_4_;
      auVar55._12_4_ = auVar39._12_4_;
      auVar6._4_8_ = auVar55._8_8_;
      auVar6._0_4_ = (int)auVar39._8_4_ >> 0x1f;
      auVar56._0_8_ = auVar6._0_8_ << 0x20;
      auVar56._8_4_ = (int)auVar39._8_4_ >> 0x1f;
      auVar56._12_4_ = auVar39._12_4_ >> 0x1f;
      auVar49._4_4_ = auVar39._8_4_;
      auVar49._0_4_ = auVar39._8_4_;
      auVar49._8_4_ = auVar39._12_4_;
      auVar49._12_4_ = auVar39._12_4_;
      uVar44 = (ulong)auVar39._8_4_ * (ulong)auVar74._8_4_ +
               ((auVar6._0_8_ & 0xffffffff) * (ulong)auVar74._8_4_ +
                (ulong)auVar39._8_4_ * (ulong)auVar74._12_4_ << 0x20) >> uVar19;
      uVar51 = (auVar49._8_8_ & 0xffffffff) * (ulong)auVar74._8_4_ +
               ((auVar56._8_8_ >> 0x20) * (ulong)auVar74._8_4_ +
                (auVar49._8_8_ & 0xffffffff) * (ulong)auVar74._12_4_ << 0x20) >> uVar19;
      auVar7._4_8_ = uVar73 << 0x20;
      auVar7._0_4_ = (int)uVar68 >> 0x1f;
      auVar43._0_8_ = auVar7._0_8_ << 0x20;
      auVar43._8_4_ = 0;
      auVar43._12_4_ = (int)uVar73 >> 0x1f;
      auVar8._4_8_ = uVar51 << 0x20;
      auVar8._0_4_ = (int)uVar44 >> 0x1f;
      auVar40._0_8_ = auVar8._0_8_ << 0x20;
      auVar40._8_4_ = 0;
      auVar40._12_4_ = (int)uVar51 >> 0x1f;
      auVar57._0_8_ = (uVar44 & 0xffffffff) * (ulong)uVar33;
      auVar57._8_8_ = (uVar51 & 0xffffffff) * (ulong)uVar33;
      auVar72._4_4_ = (int)uVar73;
      auVar72._0_4_ = (int)uVar68;
      auVar72._8_4_ = (int)uVar44;
      auVar72._12_4_ = (int)uVar51;
      auVar34 = pmovsxbd(ZEXT416(uVar18),0x1010101);
      auVar31 = psignd(auVar72,auVar76 | auVar34);
      *(undefined1 (*) [16])((long)qcoeff_ptr + uVar14 * 2 + 0x20) = ~auVar77 & auVar31;
      auVar52 = pabsd(auVar57,auVar30);
      auVar24._0_4_ = auVar52._0_4_ + iVar13;
      iVar27 = auVar52._4_4_;
      auVar24._4_4_ = iVar27 + iVar13;
      iVar28 = auVar52._8_4_;
      iVar29 = auVar52._12_4_;
      auVar24._8_4_ = iVar28 + iVar13;
      auVar24._12_4_ = iVar29 + iVar13;
      auVar31 = pmovsxdq(auVar34,auVar24);
      uVar23 = auVar31._8_8_;
      auVar67._0_8_ =
           (auVar31._0_8_ >> 0x20) * (ulong)auVar74._8_4_ +
           (ulong)auVar31._0_4_ * (ulong)auVar74._12_4_ << 0x20;
      auVar67._8_8_ =
           (uVar23 >> 0x20) * (ulong)auVar74._8_4_ + (uVar23 & 0xffffffff) * (ulong)auVar74._12_4_
           << 0x20;
      uVar63 = (ulong)(uint)log_scale;
      local_88 = (ulong)uVar18;
      uVar19 = (ulong)auVar31._0_4_ * (ulong)auVar74._8_4_ + auVar67._0_8_ >> local_88;
      uVar23 = (uVar23 & 0xffffffff) * (ulong)auVar74._8_4_ + auVar67._8_8_ >> local_88;
      auVar79._0_4_ =
           (undefined4)
           ((uVar68 & 0xffffffff) * (ulong)uVar32 +
            (auVar7._0_8_ * (ulong)uVar32 + (uVar68 & 0xffffffff) * (ulong)uVar33 << 0x20) >> uVar63
           );
      auVar79._4_4_ =
           (int)((uVar73 & 0xffffffff) * (ulong)uVar32 +
                 ((auVar43._8_8_ >> 0x20) * (ulong)uVar32 + (uVar73 & 0xffffffff) * (ulong)uVar33 <<
                 0x20) >> uVar63);
      auVar79._8_4_ =
           (int)((uVar44 & 0xffffffff) * (ulong)uVar32 +
                 (auVar8._0_8_ * (ulong)uVar32 + auVar57._0_8_ << 0x20) >> uVar63);
      auVar79._12_4_ =
           (int)((uVar51 & 0xffffffff) * (ulong)uVar32 +
                 ((auVar40._8_8_ >> 0x20) * (ulong)uVar32 + auVar57._8_8_ << 0x20) >> uVar63);
      auVar9._4_8_ = uVar23 << 0x20;
      auVar9._0_4_ = (int)uVar19 >> 0x1f;
      auVar41._0_8_ = auVar9._0_8_ << 0x20;
      auVar41._8_4_ = 0;
      auVar41._12_4_ = (int)uVar23 >> 0x1f;
      auVar58._0_4_ = auVar52._0_4_ << iVar16;
      auVar58._4_4_ = iVar27;
      auVar58._8_4_ = iVar28;
      auVar58._12_4_ = iVar29;
      auVar42._0_4_ = -(uint)(auVar58._0_4_ < iVar62);
      auVar42._4_4_ = -(uint)(iVar27 < iVar62);
      auVar42._8_4_ = -(uint)(iVar28 < iVar62);
      auVar42._12_4_ = -(uint)(iVar29 < iVar62);
      auVar10._4_8_ = auVar58._8_8_;
      auVar10._0_4_ = auVar24._8_4_;
      auVar59._0_8_ = auVar10._0_8_ << 0x20;
      auVar59._8_4_ = auVar24._8_4_;
      auVar59._12_4_ = auVar24._12_4_;
      auVar11._4_8_ = auVar59._8_8_;
      auVar11._0_4_ = (int)auVar24._8_4_ >> 0x1f;
      auVar60._0_8_ = auVar11._0_8_ << 0x20;
      auVar60._8_4_ = (int)auVar24._8_4_ >> 0x1f;
      auVar60._12_4_ = (int)auVar24._12_4_ >> 0x1f;
      auVar25._4_4_ = auVar24._8_4_;
      auVar25._0_4_ = auVar24._8_4_;
      auVar25._8_4_ = auVar24._12_4_;
      auVar25._12_4_ = auVar24._12_4_;
      uVar44 = (ulong)auVar24._8_4_ * (ulong)auVar74._8_4_ +
               ((auVar11._0_8_ & 0xffffffff) * (ulong)auVar74._8_4_ +
                (ulong)auVar74._12_4_ * (ulong)auVar24._8_4_ << 0x20) >> local_88;
      uVar51 = (auVar25._8_8_ & 0xffffffff) * (ulong)auVar74._8_4_ +
               ((auVar60._8_8_ >> 0x20) * (ulong)auVar74._8_4_ +
                (auVar74._8_8_ >> 0x20) * (ulong)auVar24._12_4_ << 0x20) >> local_88;
      auVar52 = psignd(auVar79,auVar76 | auVar34);
      auVar12._4_8_ = uVar51 << 0x20;
      auVar12._0_4_ = (int)uVar44 >> 0x1f;
      auVar61._0_8_ = auVar12._0_8_ << 0x20;
      auVar61._8_4_ = 0;
      auVar61._12_4_ = (int)uVar51 >> 0x1f;
      uVar63 = (auVar61._8_8_ >> 0x20) * (ulong)uVar32 +
               (auVar78._8_8_ >> 0x20) * (uVar51 & 0xffffffff) << 0x20;
      auVar20._4_4_ = (int)uVar23;
      auVar20._0_4_ = (int)uVar19;
      auVar20._8_4_ = (int)uVar44;
      auVar20._12_4_ = (int)uVar51;
      uVar68 = (ulong)(uint)log_scale;
      auVar50._0_4_ =
           (undefined4)
           ((uVar19 & 0xffffffff) * (ulong)uVar32 +
            (auVar9._0_8_ * (ulong)uVar32 + (uVar19 & 0xffffffff) * (ulong)uVar33 << 0x20) >> uVar68
           );
      auVar50._4_4_ =
           (int)((uVar23 & 0xffffffff) * (ulong)uVar32 +
                 ((auVar41._8_8_ >> 0x20) * (ulong)uVar32 + (uVar23 & 0xffffffff) * (ulong)uVar33 <<
                 0x20) >> uVar68);
      auVar50._8_4_ =
           (int)((uVar44 & 0xffffffff) * (ulong)uVar32 +
                 (auVar12._0_8_ * (ulong)uVar32 + (ulong)uVar33 * (uVar44 & 0xffffffff) << 0x20) >>
                uVar68);
      auVar50._12_4_ = (int)((uVar51 & 0xffffffff) * (ulong)uVar32 + uVar63 >> uVar68);
      auVar75._0_4_ = auVar30._0_4_ >> 0x1f;
      auVar75._4_4_ = auVar30._4_4_ >> 0x1f;
      auVar75._8_4_ = auVar30._8_4_ >> 0x1f;
      auVar75._12_4_ = auVar30._12_4_ >> 0x1f;
      auVar34 = psignd(auVar20,auVar75 | _DAT_004cfed0);
      auVar31 = psignd(auVar50,auVar75 | _DAT_004cfed0);
      *(undefined1 (*) [16])((long)dqcoeff_ptr + uVar14 * 2 + 0x20) = ~auVar77 & auVar52;
      *(undefined1 (*) [16])((long)qcoeff_ptr + uVar14 * 2 + 0x30) = ~auVar42 & auVar34;
      *(undefined1 (*) [16])((long)dqcoeff_ptr + uVar14 * 2 + 0x30) = ~auVar42 & auVar31;
      local_48 = auVar38._0_2_;
      sStack_46 = auVar38._2_2_;
      sStack_44 = auVar38._4_2_;
      sStack_42 = auVar38._6_2_;
      sStack_40 = auVar38._8_2_;
      sStack_3e = auVar38._10_2_;
      sStack_3c = auVar38._12_2_;
      sStack_3a = auVar38._14_2_;
      piVar1 = (int *)((long)qcoeff_ptr + uVar14 * 2 + 0x20);
      piVar2 = (int *)((long)qcoeff_ptr + uVar14 * 2 + 0x30);
      auVar21._0_4_ = -(uint)(*piVar1 == 0);
      auVar21._4_4_ = -(uint)(piVar1[1] == 0);
      auVar21._8_4_ = -(uint)(piVar1[2] == 0);
      auVar21._12_4_ = -(uint)(piVar1[3] == 0);
      auVar26._0_4_ = -(uint)(*piVar2 == 0);
      auVar26._4_4_ = -(uint)(piVar2[1] == 0);
      auVar26._8_4_ = -(uint)(piVar2[2] == 0);
      auVar26._12_4_ = -(uint)(piVar2[3] == 0);
      auVar34 = packssdw(auVar21,auVar26);
      psVar3 = (short *)((long)iscan + uVar14 + 0x10);
      auVar22._0_2_ = *psVar3 + auVar34._0_2_ + 1;
      auVar22._2_2_ = psVar3[1] + auVar34._2_2_ + 1;
      auVar22._4_2_ = psVar3[2] + auVar34._4_2_ + 1;
      auVar22._6_2_ = psVar3[3] + auVar34._6_2_ + 1;
      auVar22._8_2_ = psVar3[4] + auVar34._8_2_ + 1;
      auVar22._10_2_ = psVar3[5] + auVar34._10_2_ + 1;
      auVar22._12_2_ = psVar3[6] + auVar34._12_2_ + 1;
      auVar22._14_2_ = psVar3[7] + auVar34._14_2_ + 1;
      auVar22 = ~auVar34 & auVar22;
      sVar4 = auVar22._0_2_;
      auVar38._0_2_ = (ushort)(local_48 < sVar4) * sVar4 | (ushort)(local_48 >= sVar4) * local_48;
      sVar4 = auVar22._2_2_;
      auVar38._2_2_ = (ushort)(sStack_46 < sVar4) * sVar4 | (ushort)(sStack_46 >= sVar4) * sStack_46
      ;
      sVar4 = auVar22._4_2_;
      auVar38._4_2_ = (ushort)(sStack_44 < sVar4) * sVar4 | (ushort)(sStack_44 >= sVar4) * sStack_44
      ;
      sVar4 = auVar22._6_2_;
      auVar38._6_2_ = (ushort)(sStack_42 < sVar4) * sVar4 | (ushort)(sStack_42 >= sVar4) * sStack_42
      ;
      sVar4 = auVar22._8_2_;
      auVar38._8_2_ = (ushort)(sStack_40 < sVar4) * sVar4 | (ushort)(sStack_40 >= sVar4) * sStack_40
      ;
      sVar4 = auVar22._10_2_;
      auVar38._10_2_ =
           (ushort)(sStack_3e < sVar4) * sVar4 | (ushort)(sStack_3e >= sVar4) * sStack_3e;
      sVar4 = auVar22._12_2_;
      auVar38._12_2_ =
           (ushort)(sStack_3c < sVar4) * sVar4 | (ushort)(sStack_3c >= sVar4) * sStack_3c;
      sVar4 = auVar22._14_2_;
      auVar38._14_2_ =
           (ushort)(sStack_3a < sVar4) * sVar4 | (ushort)(sStack_3a >= sVar4) * sStack_3a;
      lVar17 = lVar17 + -8;
      uVar14 = uVar14 + 0x10;
    } while (0x10 < lVar17);
  }
  auVar34 = phminposuw(auVar38 ^ _DAT_00516ec0);
  *eob_ptr = auVar34._0_2_ ^ 0x7fff;
  return;
}

Assistant:

void av1_highbd_quantize_fp_sse4_1(
    const tran_low_t *coeff_ptr, intptr_t count, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan, int log_scale) {
  __m128i coeff[2], qcoeff[3], dequant[2], qparam[4], coeff_sign;
  __m128i eob = _mm_setzero_si128();
  const tran_low_t *src = coeff_ptr;
  tran_low_t *quanAddr = qcoeff_ptr;
  tran_low_t *dquanAddr = dqcoeff_ptr;
  const int shift = 16 - log_scale;
  const int coeff_stride = 4;
  const int quan_stride = coeff_stride;
  (void)zbin_ptr;
  (void)quant_shift_ptr;
  (void)scan;

  memset(quanAddr, 0, count * sizeof(quanAddr[0]));
  memset(dquanAddr, 0, count * sizeof(dquanAddr[0]));

  coeff[0] = _mm_loadu_si128((__m128i const *)src);
  const int round1 = ROUND_POWER_OF_TWO(round_ptr[1], log_scale);
  const int round0 = ROUND_POWER_OF_TWO(round_ptr[0], log_scale);

  qparam[0] = _mm_set_epi32(round1, round1, round1, round0);
  qparam[1] = _mm_set_epi64x((uint32_t)quant_ptr[1], (uint32_t)quant_ptr[0]);
  qparam[2] =
      _mm_set_epi64x((uint32_t)dequant_ptr[1], (uint32_t)dequant_ptr[0]);
  qparam[3] = _mm_set_epi32(dequant_ptr[1], dequant_ptr[1], dequant_ptr[1],
                            dequant_ptr[0]);

  // DC and first 3 AC
  quantize_coeff_phase1(&coeff[0], qparam, shift, log_scale, qcoeff, dequant,
                        &coeff_sign);

  // update round/quan/dquan for AC
  qparam[0] = _mm_unpackhi_epi64(qparam[0], qparam[0]);
  qparam[1] = _mm_set1_epi64x((uint32_t)quant_ptr[1]);
  qparam[2] = _mm_set1_epi64x((uint32_t)dequant_ptr[1]);
  qparam[3] = _mm_set1_epi32(dequant_ptr[1]);
  quantize_coeff_phase2(qcoeff, dequant, &coeff_sign, qparam, shift, log_scale,
                        quanAddr, dquanAddr);

  // next 4 AC
  coeff[1] = _mm_loadu_si128((__m128i const *)(src + coeff_stride));
  quantize_coeff_phase1(&coeff[1], qparam, shift, log_scale, qcoeff, dequant,
                        &coeff_sign);
  quantize_coeff_phase2(qcoeff, dequant, &coeff_sign, qparam, shift, log_scale,
                        quanAddr + quan_stride, dquanAddr + quan_stride);

  find_eob(quanAddr, iscan, &eob);

  count -= 8;

  // loop for the rest of AC
  while (count > 0) {
    src += coeff_stride << 1;
    quanAddr += quan_stride << 1;
    dquanAddr += quan_stride << 1;
    iscan += quan_stride << 1;

    coeff[0] = _mm_loadu_si128((__m128i const *)src);
    coeff[1] = _mm_loadu_si128((__m128i const *)(src + coeff_stride));

    quantize_coeff_phase1(&coeff[0], qparam, shift, log_scale, qcoeff, dequant,
                          &coeff_sign);
    quantize_coeff_phase2(qcoeff, dequant, &coeff_sign, qparam, shift,
                          log_scale, quanAddr, dquanAddr);

    quantize_coeff_phase1(&coeff[1], qparam, shift, log_scale, qcoeff, dequant,
                          &coeff_sign);
    quantize_coeff_phase2(qcoeff, dequant, &coeff_sign, qparam, shift,
                          log_scale, quanAddr + quan_stride,
                          dquanAddr + quan_stride);

    find_eob(quanAddr, iscan, &eob);

    count -= 8;
  }
  *eob_ptr = get_accumulated_eob(&eob);
}